

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_declaration.h
# Opt level: O1

void __thiscall ncnn::Einsum_final::~Einsum_final(Einsum_final *this)

{
  _func_int *p_Var1;
  
  p_Var1 = this->_vptr_Einsum_final[-3];
  ((Layer *)(&this->field_0x8 + (long)p_Var1))->_vptr_Layer = (_func_int **)&PTR__Einsum_005e2808;
  if (*(long **)(&this->field_0xf0 + (long)p_Var1) != (long *)(&this->field_0x100 + (long)p_Var1)) {
    operator_delete(*(long **)(&this->field_0xf0 + (long)p_Var1),
                    *(long *)(&this->field_0x100 + (long)p_Var1) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(&this->field_0xd8 + (long)p_Var1));
  Layer::~Layer((Layer *)(&this->field_0x8 + (long)p_Var1));
  return;
}

Assistant:

virtual int create_pipeline(const Option& opt) {
        { int ret = Einsum::create_pipeline(opt); if (ret) return ret; }
        return 0;
    }